

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  NamedLabelSyntax *pNVar1;
  Compilation *compilation;
  StatementSyntax *syntax_00;
  SourceLocation SVar2;
  StatementBlockSymbol *pSVar3;
  SyntaxNode *this;
  ForVariableDeclarationSyntax *syntax_01;
  VariableSymbol *lastVar;
  size_t index;
  ulong uVar4;
  string_view sVar5;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar6;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffa0;
  Token local_48;
  
  SVar2 = parsing::Token::location(&syntax->forKeyword);
  pNVar1 = (syntax->super_StatementSyntax).label;
  if (pNVar1 == (NamedLabelSyntax *)0x0) {
    sVar5 = (string_view)(ZEXT816(0x3f0621) << 0x40);
  }
  else {
    local_48.kind = (pNVar1->name).kind;
    local_48._2_1_ = (pNVar1->name).field_0x2;
    local_48.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_48.rawLen = (pNVar1->name).rawLen;
    local_48.info = (pNVar1->name).info;
    sVar5 = parsing::Token::valueText(&local_48);
    SVar2 = parsing::Token::location(&local_48);
  }
  name._M_str = (char *)SVar2;
  name._M_len = (size_t)sVar5._M_str;
  pSVar3 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar5._M_len,name,
                       (SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffa0);
  uVar4 = (syntax->initializers).elements.size_ + 1;
  if (1 < uVar4) {
    compilation = scope->compilation;
    lastVar = (VariableSymbol *)0x0;
    index = 0;
    do {
      this = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                       (&syntax->initializers,index);
      syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ForVariableDeclarationSyntax>(this);
      lastVar = VariableSymbol::fromSyntax(compilation,syntax_01,lastVar);
      Scope::addMember(&pSVar3->super_Scope,(Symbol *)lastVar);
      index = index + 1;
    } while (uVar4 >> 1 != index);
  }
  syntax_00 = (syntax->statement).ptr;
  if (syntax_00 != (StatementSyntax *)0x0) {
    sVar6 = Statement::createAndAddBlockItems(&pSVar3->super_Scope,syntax_00,false);
    pSVar3->blocks = sVar6;
    return pSVar3;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
            );
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}